

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O3

int mbedtls_x509_get_sig(uchar **p,uchar *end,mbedtls_x509_buf *sig)

{
  byte bVar1;
  byte *pbVar2;
  uchar *puVar3;
  int iVar4;
  size_t len;
  size_t local_20;
  
  pbVar2 = *p;
  if (end != pbVar2 && -1 < (long)end - (long)pbVar2) {
    bVar1 = *pbVar2;
    iVar4 = mbedtls_asn1_get_bitstring_null(p,end,&local_20);
    if (iVar4 == 0) {
      sig->tag = (uint)bVar1;
      sig->len = local_20;
      puVar3 = *p;
      sig->p = puVar3;
      *p = puVar3 + local_20;
      iVar4 = 0;
    }
    else {
      iVar4 = iVar4 + -0x2480;
    }
    return iVar4;
  }
  return -0x24e0;
}

Assistant:

int mbedtls_x509_get_sig( unsigned char **p, const unsigned char *end, mbedtls_x509_buf *sig )
{
    int ret;
    size_t len;
    int tag_type;

    if( ( end - *p ) < 1 )
        return( MBEDTLS_ERR_X509_INVALID_SIGNATURE +
                MBEDTLS_ERR_ASN1_OUT_OF_DATA );

    tag_type = **p;

    if( ( ret = mbedtls_asn1_get_bitstring_null( p, end, &len ) ) != 0 )
        return( MBEDTLS_ERR_X509_INVALID_SIGNATURE + ret );

    sig->tag = tag_type;
    sig->len = len;
    sig->p = *p;

    *p += len;

    return( 0 );
}